

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void unicodeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Mem *pMem;
  u32 uVar1;
  uchar *z;
  uchar *local_10;
  
  local_10 = (uchar *)sqlite3ValueText(*argv,'\x01');
  if ((local_10 != (uchar *)0x0) && (*local_10 != '\0')) {
    uVar1 = sqlite3Utf8Read(&local_10);
    pMem = context->pOut;
    if ((pMem->flags & 0x2460) != 0) {
      vdbeReleaseAndSetInt64(pMem,(long)(int)uVar1);
      return;
    }
    (pMem->u).i = (long)(int)uVar1;
    pMem->flags = 4;
  }
  return;
}

Assistant:

static void unicodeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *z = sqlite3_value_text(argv[0]);
  (void)argc;
  if( z && z[0] ) sqlite3_result_int(context, sqlite3Utf8Read(&z));
}